

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O3

void __thiscall
vkb::detail::GenericFeatureChain::add<VkPhysicalDeviceVulkan11Features>
          (GenericFeatureChain *this,VkPhysicalDeviceVulkan11Features *features)

{
  pointer *ppGVar1;
  iterator __position;
  GenericFeaturesPNextNode *this_00;
  GenericFeaturesPNextNode local_438;
  
  this_00 = (this->nodes).
            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->nodes).
       super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != __position._M_current) {
    do {
      if (features->sType == this_00->sType) {
        memset(local_438.fields + 0xc,0,0x3d0);
        local_438.sType = features->sType;
        local_438._4_4_ = *(undefined4 *)&features->field_0x4;
        local_438.pNext = features->pNext;
        local_438.fields[0] = features->storageBuffer16BitAccess;
        local_438.fields[1] = features->uniformAndStorageBuffer16BitAccess;
        local_438.fields[2] = features->storagePushConstant16;
        local_438.fields[3] = features->storageInputOutput16;
        local_438.fields[4] = features->multiview;
        local_438.fields[5] = features->multiviewGeometryShader;
        local_438.fields[6] = features->multiviewTessellationShader;
        local_438.fields[7] = features->variablePointersStorageBuffer;
        local_438.fields[8] = features->variablePointers;
        local_438.fields[9] = features->protectedMemory;
        local_438.fields[10] = features->samplerYcbcrConversion;
        local_438.fields[0xb] = features->shaderDrawParameters;
        GenericFeaturesPNextNode::combine(this_00,&local_438);
        return;
      }
      this_00 = this_00 + 1;
    } while (this_00 != __position._M_current);
  }
  memset(local_438.fields + 0xc,0,0x3d0);
  local_438.sType = features->sType;
  local_438._4_4_ = *(undefined4 *)&features->field_0x4;
  local_438.pNext = features->pNext;
  local_438.fields[0] = features->storageBuffer16BitAccess;
  local_438.fields[1] = features->uniformAndStorageBuffer16BitAccess;
  local_438.fields[2] = features->storagePushConstant16;
  local_438.fields[3] = features->storageInputOutput16;
  local_438.fields[4] = features->multiview;
  local_438.fields[5] = features->multiviewGeometryShader;
  local_438.fields[6] = features->multiviewTessellationShader;
  local_438.fields[7] = features->variablePointersStorageBuffer;
  local_438.fields[8] = features->variablePointers;
  local_438.fields[9] = features->protectedMemory;
  local_438.fields[10] = features->samplerYcbcrConversion;
  local_438.fields[0xb] = features->shaderDrawParameters;
  if (__position._M_current ==
      (this->nodes).
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
    ::_M_realloc_insert<vkb::detail::GenericFeaturesPNextNode>(&this->nodes,__position,&local_438);
  }
  else {
    memcpy(__position._M_current,&local_438,0x410);
    ppGVar1 = &(this->nodes).
               super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  return;
}

Assistant:

void add(T const& features) noexcept {
        // If this struct is already in the list, combine it
        for (auto& node : nodes) {
            if (static_cast<VkStructureType>(features.sType) == node.sType) {
                node.combine(features);
                return;
            }
        }
        // Otherwise append to the end
        nodes.push_back(features);
    }